

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

ex_ex * ex_parse(expr *x,ex_ex *iptr,ex_ex *optr,long *argc)

{
  t_float *ptVar1;
  anon_union_8_5_735de1bb_for_ex_cont *paVar2;
  ex_ex *peVar3;
  char *pcVar4;
  ex_ex *local_88;
  long local_78;
  long ac;
  long count;
  long pre;
  ex_ex *tmpex;
  ex_ex savex;
  ex_ex *lowpre;
  ex_ex *eptr;
  long *argc_local;
  ex_ex *optr_local;
  ex_ex *iptr_local;
  expr *x_local;
  
  savex.ex_end = (ex_ex *)0x0;
  memset(&tmpex,0,0x18);
  count = 0x640000;
  if (iptr == (ex_ex *)0x0) {
    post("ex_parse: input is null, iptr = 0x%lx\n",0);
    x_local = (expr *)0x0;
  }
  else if (iptr->ex_type == 0) {
    x_local = (expr *)0x0;
  }
  else {
    ac = 0;
    for (lowpre = iptr; lowpre->ex_type != 0; lowpre = lowpre + 1) {
      switch(lowpre->ex_type) {
      case 3:
        if (((lowpre->ex_cont).v_int == 0x20002) &&
           (((argc == (long *)0x0 || (ac == 0)) || (lowpre[1].ex_type == 0)))) {
          post("expr: syntax error: illegal comma\n");
          local_88 = iptr;
          if (lowpre[1].ex_type != 0) {
            local_88 = lowpre;
          }
          ex_print(local_88);
          return (ex_ex *)0x0;
        }
        if (lowpre[1].ex_type == 0) {
          post("expr: syntax error: missing operand\n");
          ex_print(iptr);
          return (ex_ex *)0x0;
        }
        if (((lowpre->ex_cont).v_int & 0xffff0000U) <= (ulong)count) {
          count = (lowpre->ex_cont).v_int & 0xffff0000;
          savex.ex_end = lowpre;
        }
        break;
      case 4:
      default:
        ex_print(lowpre);
        post("expr: ex_parse: type = 0x%lx\n",lowpre->ex_type);
        return (ex_ex *)0x0;
      case 5:
      case 0xd:
      case 0x10:
      case 0x12:
        if (lowpre[1].ex_type != 10) {
          post("expr: syntax error: brackets missing\n");
          ex_print(lowpre);
          return (ex_ex *)0x0;
        }
        if ((ac == 0) && (*(long *)(lowpre[1].ex_cont.v_int + 0x20) == 0)) {
          ptVar1 = lowpre[1].ex_cont.v_vec;
          tmpex = *(ex_ex **)ptVar1;
          savex.ex_cont = *(anon_union_8_5_735de1bb_for_ex_cont *)(ptVar1 + 2);
          savex.ex_type = *(long *)(ptVar1 + 4);
          paVar2 = (anon_union_8_5_735de1bb_for_ex_cont *)lowpre[1].ex_cont.v_vec;
          *paVar2 = nullex.ex_cont;
          paVar2[1].v_int = nullex.ex_type;
          paVar2[2].v_vec = (t_float *)nullex.ex_end;
          optr->ex_cont = lowpre->ex_cont;
          optr->ex_type = lowpre->ex_type;
          optr->ex_end = lowpre->ex_end;
          peVar3 = ex_parse(x,lowpre + 2,optr + 1,(long *)0x0);
          ptVar1 = lowpre[1].ex_cont.v_vec;
          *(ex_ex **)ptVar1 = tmpex;
          *(anon_union_8_5_735de1bb_for_ex_cont *)(ptVar1 + 2) = savex.ex_cont;
          *(long *)(ptVar1 + 4) = savex.ex_type;
          optr->ex_end = peVar3;
          return peVar3;
        }
        lowpre = (ex_ex *)lowpre[1].ex_cont.v_vec;
        break;
      case 6:
        if (lowpre[1].ex_type != 9) {
          post("expr: ex_parse: no parenthesis\n");
          return (ex_ex *)0x0;
        }
        if ((ac == 0) && (*(long *)(lowpre[1].ex_cont.v_int + 0x20) == 0)) {
          if ((ex_ex *)lowpre[1].ex_cont.v_int == lowpre + 2) {
            post("expr: syntax error: missing argument\n");
            ex_print(lowpre);
            return (ex_ex *)0x0;
          }
          local_78 = 0;
          ptVar1 = lowpre[1].ex_cont.v_vec;
          tmpex = *(ex_ex **)ptVar1;
          savex.ex_cont = *(anon_union_8_5_735de1bb_for_ex_cont *)(ptVar1 + 2);
          savex.ex_type = *(long *)(ptVar1 + 4);
          paVar2 = (anon_union_8_5_735de1bb_for_ex_cont *)lowpre[1].ex_cont.v_vec;
          *paVar2 = nullex.ex_cont;
          paVar2[1].v_int = nullex.ex_type;
          paVar2[2].v_vec = (t_float *)nullex.ex_end;
          optr->ex_cont = lowpre->ex_cont;
          optr->ex_type = lowpre->ex_type;
          optr->ex_end = lowpre->ex_end;
          savex.ex_end = ex_parse(x,lowpre + 2,optr + 1,&local_78);
          if (savex.ex_end == (ex_ex *)0x0) {
            return (ex_ex *)0x0;
          }
          local_78 = local_78 + 1;
          if (local_78 != *(long *)((lowpre->ex_cont).v_int + 0x10)) {
            post("expr: syntax error: function \'%s\' needs %ld arguments\n",
                 *(undefined8 *)(lowpre->ex_cont).v_vec,
                 *(undefined8 *)((lowpre->ex_cont).v_int + 0x10));
            return (ex_ex *)0x0;
          }
          ptVar1 = lowpre[1].ex_cont.v_vec;
          *(ex_ex **)ptVar1 = tmpex;
          *(anon_union_8_5_735de1bb_for_ex_cont *)(ptVar1 + 2) = savex.ex_cont;
          *(long *)(ptVar1 + 4) = savex.ex_type;
          optr->ex_end = savex.ex_end;
          return savex.ex_end;
        }
        lowpre = (ex_ex *)lowpre[1].ex_cont.v_vec;
        break;
      case 7:
      case 8:
        if (argc == (long *)0x0) {
          post("expr: syntax error: symbols allowed for functions only\n");
          ex_print(lowpre);
          return (ex_ex *)0x0;
        }
      case 1:
      case 2:
      case 0xb:
      case 0xc:
      case 0xe:
      case 0x11:
      case 0x14:
      case 0x15:
        if ((ac == 0) && (lowpre[1].ex_type == 0)) {
          optr->ex_cont = lowpre->ex_cont;
          optr->ex_type = lowpre->ex_type;
          optr->ex_end = lowpre->ex_end;
          optr->ex_end = optr + 1;
          return optr + 1;
        }
        break;
      case 9:
      case 10:
        if ((ac == 0) && (*(long *)((lowpre->ex_cont).v_int + 0x20) == 0)) {
          if ((ex_ex *)(lowpre->ex_cont).v_int == lowpre + 1) {
            pcVar4 = "[]";
            if (lowpre->ex_type == 9) {
              pcVar4 = "()";
            }
            post("expr: syntax error: empty \'%s\'\n",pcVar4);
            ex_print(lowpre);
            return (ex_ex *)0x0;
          }
          ptVar1 = (lowpre->ex_cont).v_vec;
          tmpex = *(ex_ex **)ptVar1;
          savex.ex_cont = *(anon_union_8_5_735de1bb_for_ex_cont *)(ptVar1 + 2);
          savex.ex_type = *(long *)(ptVar1 + 4);
          paVar2 = (anon_union_8_5_735de1bb_for_ex_cont *)(lowpre->ex_cont).v_vec;
          *paVar2 = nullex.ex_cont;
          paVar2[1].v_int = nullex.ex_type;
          paVar2[2].v_vec = (t_float *)nullex.ex_end;
          peVar3 = ex_parse(x,lowpre + 1,optr,(long *)0x0);
          ptVar1 = (lowpre->ex_cont).v_vec;
          *(ex_ex **)ptVar1 = tmpex;
          *(anon_union_8_5_735de1bb_for_ex_cont *)(ptVar1 + 2) = savex.ex_cont;
          *(long *)(ptVar1 + 4) = savex.ex_type;
          optr->ex_end = peVar3;
          return peVar3;
        }
        lowpre = (ex_ex *)(lowpre->ex_cont).v_vec;
      }
      ac = ac + 1;
    }
    if (count == 0x640000) {
      post("expr: syntax error: missing operation\n");
      ex_print(iptr);
      x_local = (expr *)0x0;
    }
    else if (ac < 2) {
      post("expr: syntax error: mission operand\n");
      ex_print(iptr);
      x_local = (expr *)0x0;
    }
    else if (ac == 2) {
      if (savex.ex_end == iptr) {
        if (((((savex.ex_end)->ex_cont).v_int == 0xe0017) ||
            (((savex.ex_end)->ex_cont).v_int == 0xe0016)) ||
           (((savex.ex_end)->ex_cont).v_int == 0xe0015)) {
          optr->ex_cont = (savex.ex_end)->ex_cont;
          optr->ex_type = (savex.ex_end)->ex_type;
          optr->ex_end = (savex.ex_end)->ex_end;
          x_local = (expr *)ex_parse(x,savex.ex_end + 1,optr + 1,argc);
          optr->ex_end = (ex_ex *)x_local;
        }
        else {
          post("expr: syntax error: not a uniary operator\n");
          ex_print(iptr);
          x_local = (expr *)0x0;
        }
      }
      else {
        post("expr: ex_parse: unary operator should be first\n");
        x_local = (expr *)0x0;
      }
    }
    else if ((ac == 3) &&
            (((((savex.ex_end)->ex_cont).v_int == 0xe0017 ||
              (((savex.ex_end)->ex_cont).v_int == 0xe0016)) ||
             (((savex.ex_end)->ex_cont).v_int == 0xe0015)))) {
      post("expr: syntax error, missing operand before unary operator\n");
      ex_print(iptr);
      x_local = (expr *)0x0;
    }
    else if (savex.ex_end == iptr) {
      post("expr: syntax error: mission operand\n");
      ex_print(iptr);
      x_local = (expr *)0x0;
    }
    else {
      tmpex = (ex_ex *)((savex.ex_end)->ex_cont).v_vec;
      savex.ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)(savex.ex_end)->ex_type;
      savex.ex_type = (long)(savex.ex_end)->ex_end;
      (savex.ex_end)->ex_cont = nullex.ex_cont;
      (savex.ex_end)->ex_type = nullex.ex_type;
      (savex.ex_end)->ex_end = nullex.ex_end;
      if (tmpex == (ex_ex *)0x20002) {
        *argc = *argc + 1;
        lowpre = ex_parse(x,iptr,optr,argc);
      }
      else {
        (optr->ex_cont).v_vec = (t_float *)tmpex;
        optr->ex_type = (long)savex.ex_cont;
        optr->ex_end = (ex_ex *)savex.ex_type;
        lowpre = ex_parse(x,iptr,optr + 1,argc);
      }
      if (lowpre != (ex_ex *)0x0) {
        lowpre = ex_parse(x,savex.ex_end + 1,lowpre,argc);
        ((savex.ex_end)->ex_cont).v_vec = (t_float *)tmpex;
        (savex.ex_end)->ex_type = (long)savex.ex_cont;
        (savex.ex_end)->ex_end = (ex_ex *)savex.ex_type;
      }
      optr->ex_end = lowpre;
      x_local = (expr *)lowpre;
    }
  }
  return (ex_ex *)x_local;
}

Assistant:

struct ex_ex *
ex_parse(struct expr *x, struct ex_ex *iptr, struct ex_ex *optr, long int *argc)
{
        struct ex_ex *eptr;
        struct ex_ex *lowpre = 0;       /* pointer to the lowest precedence */
        struct ex_ex savex = { 0 };
        struct ex_ex *tmpex;
        long pre = HI_PRE;
        long count;

        if (!iptr) {
                post("ex_parse: input is null, iptr = 0x%lx\n", iptr);
                return (exNULL);
        }
        if (!iptr->ex_type)
                return (exNULL);

        /*
         * the following loop finds the lowest precedence operator in the
         * the input token list, comma is explicitly checked here since
         * that is a special operator and is only legal in functions
         */
        for (eptr = iptr, count = 0; eptr->ex_type; eptr++, count++)
                switch (eptr->ex_type) {
                case ET_SYM:
                case ET_VSYM:
                        if (!argc) {
                                post("expr: syntax error: symbols allowed for functions only\n");
                                ex_print(eptr);
                                return (exNULL);
                        }   /* falls through */
                case ET_INT:
                case ET_FLT:
                case ET_II:
                case ET_FI:
                case ET_XI0:
                case ET_YOM1:
                case ET_VI:
                case ET_VAR:
                        if (!count && !eptr[1].ex_type) {
                                *optr = *eptr;
                                                                tmpex = optr;
                                                                tmpex->ex_end = ++optr;
                                return (optr);
                        }
                        break;
                case ET_XI:
                case ET_YO:
                case ET_SI:
                case ET_TBL:
                        if (eptr[1].ex_type != ET_LB) {
                                post("expr: syntax error: brackets missing\n");
                                ex_print(eptr);
                                return (exNULL);
                        }
                        /* if this table is the only token, parse the table */
                        if (!count &&
                            !((struct ex_ex *) eptr[1].ex_ptr)[1].ex_type) {
                                savex = *((struct ex_ex *) eptr[1].ex_ptr);
                                *((struct ex_ex *) eptr[1].ex_ptr) = nullex;
                                *optr = *eptr;
                                lowpre = ex_parse(x, &eptr[2], optr + 1, (long *)0);
                                *((struct ex_ex *) eptr[1].ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return(lowpre);
                        }
                        eptr = (struct ex_ex *) eptr[1].ex_ptr;
                        break;
                case ET_OP:
                        if (eptr->ex_op == OP_COMMA) {
                                if (!argc || !count || !eptr[1].ex_type) {
                                        post("expr: syntax error: illegal comma\n");
                                        ex_print(eptr[1].ex_type ? eptr : iptr);
                                        return (exNULL);
                                }
                        }
                        if (!eptr[1].ex_type) {
                                post("expr: syntax error: missing operand\n");
                                ex_print(iptr);
                                return (exNULL);
                        }
                        if ((eptr->ex_op & PRE_MASK) <= pre) {
                                pre = eptr->ex_op & PRE_MASK;
                                lowpre = eptr;
                        }
                        break;
                case ET_FUNC:
                        if (eptr[1].ex_type != ET_LP) {
                                post("expr: ex_parse: no parenthesis\n");
                                return (exNULL);
                        }
                        /* if this function is the only token, parse it */
                        if (!count &&
                            !((struct ex_ex *) eptr[1].ex_ptr)[1].ex_type) {
                                long ac;

                                if (eptr[1].ex_ptr == (char *) &eptr[2]) {
                                        post("expr: syntax error: missing argument\n");
                                        ex_print(eptr);
                                        return (exNULL);
                                }
                                ac = 0;
                                savex = *((struct ex_ex *) eptr[1].ex_ptr);
                                *((struct ex_ex *) eptr[1].ex_ptr) = nullex;
                                *optr = *eptr;
                                lowpre = ex_parse(x, &eptr[2], optr + 1, &ac);
                                if (!lowpre)
                                        return (exNULL);
                                ac++;
                                if (ac !=
                                    ((t_ex_func *)eptr->ex_ptr)->f_argc){
                                        post("expr: syntax error: function '%s' needs %ld arguments\n",
                                            ((t_ex_func *)eptr->ex_ptr)->f_name,
                                            ((t_ex_func *)eptr->ex_ptr)->f_argc);
                                        return (exNULL);
                                }
                                *((struct ex_ex *) eptr[1].ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return (lowpre);
                        }
                        eptr = (struct ex_ex *) eptr[1].ex_ptr;
                        break;
                case ET_LP:
                case ET_LB:
                        if (!count &&
                            !((struct ex_ex *) eptr->ex_ptr)[1].ex_type) {
                                if (eptr->ex_ptr == (char *)(&eptr[1])) {
                                        post("expr: syntax error: empty '%s'\n",
                                            eptr->ex_type==ET_LP?"()":"[]");
                                        ex_print(eptr);
                                        return (exNULL);
                                }
                                savex = *((struct ex_ex *) eptr->ex_ptr);
                                *((struct ex_ex *) eptr->ex_ptr) = nullex;
                                lowpre = ex_parse(x, &eptr[1], optr, (long *)0);
                                *((struct ex_ex *) eptr->ex_ptr) = savex;
                                                                optr->ex_end = lowpre;
                                return (lowpre);
                        }
                        eptr = (struct ex_ex *)eptr->ex_ptr;
                        break;
                case ET_STR:
                default:
                        ex_print(eptr);
                        post("expr: ex_parse: type = 0x%lx\n", eptr->ex_type);
                        return (exNULL);
                }

        if (pre == HI_PRE) {
                post("expr: syntax error: missing operation\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (count < 2) {
                post("expr: syntax error: mission operand\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (count == 2) {
                if (lowpre != iptr) {
                        post("expr: ex_parse: unary operator should be first\n");
                        return (exNULL);
                }
                if (!unary_op(lowpre->ex_op)) {
                        post("expr: syntax error: not a uniary operator\n");
                        ex_print(iptr);
                        return (exNULL);
                }
                *optr = *lowpre;
                eptr = ex_parse(x, &lowpre[1], optr + 1, argc);
                                optr->ex_end = eptr;
                return (eptr);
        }
        /* this is the case of using unary operator as a binary opetator */
        if (count == 3 && unary_op(lowpre->ex_op)) {
                post("expr: syntax error, missing operand before unary operator\n");
                ex_print(iptr);
                return (exNULL);
        }
        if (lowpre == iptr) {
                post("expr: syntax error: mission operand\n");
                ex_print(iptr);
                return (exNULL);
        }
        savex = *lowpre;
        *lowpre = nullex;
        if (savex.ex_op != OP_COMMA) {
            *optr = savex;
                eptr = ex_parse(x, iptr, optr + 1, argc);
                } else {
            (*argc)++;
                eptr = ex_parse(x, iptr, optr, argc);
                }
        if (eptr) {
                eptr = ex_parse(x, &lowpre[1], eptr, argc);
                *lowpre = savex;
        }
                optr->ex_end = eptr;
        return (eptr);
}